

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  bool bVar1;
  uint32 uVar2;
  ScriptContext *this;
  SnapJavascriptAsyncSpawnStepFunctionInfo *pSVar3;
  JavascriptLibrary *this_00;
  JavascriptAsyncSpawnStepFunction *pJVar4;
  Var local_70;
  Var local_68;
  Var local_60;
  JavascriptMethod local_58;
  JavascriptMethod entryPoint;
  JavascriptGenerator *generator;
  bool isReject;
  Var argument;
  Var resolve;
  Var reject;
  SnapJavascriptAsyncSpawnStepFunctionInfo *info;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar3 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapJavascriptAsyncSpawnStepFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)40>
                     (snpObject);
  if (pSVar3->reject == (TTDVar)0x0) {
    local_60 = (Var)0x0;
  }
  else {
    local_60 = InflateMap::InflateTTDVar(inflator,pSVar3->reject);
  }
  if (pSVar3->resolve == (TTDVar)0x0) {
    local_68 = (Var)0x0;
  }
  else {
    local_68 = InflateMap::InflateTTDVar(inflator,pSVar3->resolve);
  }
  if (pSVar3->argument == (TTDVar)0x0) {
    local_70 = (Var)0x0;
  }
  else {
    local_70 = InflateMap::InflateTTDVar(inflator,pSVar3->argument);
  }
  bVar1 = pSVar3->isReject;
  entryPoint = (JavascriptMethod)0x0;
  if (pSVar3->generator != 0) {
    entryPoint = (JavascriptMethod)InflateMap::LookupObject(inflator,pSVar3->generator);
  }
  uVar2 = pSVar3->entryPoint;
  if (uVar2 == 1) {
    local_58 = Js::JavascriptAsyncFunction::EntryAsyncSpawnStepNextFunction;
  }
  else if (uVar2 == 2) {
    local_58 = Js::JavascriptAsyncFunction::EntryAsyncSpawnStepThrowFunction;
  }
  else {
    if (uVar2 != 3) {
      TTDAbort_unrecoverable_error
                ("Unexpected value for entryPoint when inflating JavascriptAsyncSpawnStepFunction");
    }
    local_58 = Js::JavascriptAsyncFunction::EntryAsyncSpawnCallStepFunction;
  }
  this_00 = Js::ScriptContext::GetLibrary(this);
  pJVar4 = Js::JavascriptLibrary::CreateAsyncSpawnStepFunction
                     (this_00,local_58,(JavascriptGenerator *)entryPoint,local_70,local_68,local_60,
                      (bool)(bVar1 & 1));
  return (RecyclableObject *)pJVar4;
}

Assistant:

Js::RecyclableObject *DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo(const SnapObject *snpObject, InflateMap *inflator)
        {
            Js::ScriptContext *ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapJavascriptAsyncSpawnStepFunctionInfo* info = SnapObjectGetAddtlInfoAs<SnapJavascriptAsyncSpawnStepFunctionInfo *, SnapObjectType::JavascriptAsyncSpawnStepFunction>(snpObject);
            Js::Var reject = (info->reject != nullptr) ? inflator->InflateTTDVar(info->reject) : nullptr;
            Js::Var resolve = (info->resolve != nullptr) ? inflator->InflateTTDVar(info->resolve) : nullptr;
            Js::Var argument = (info->argument != nullptr) ? inflator->InflateTTDVar(info->argument) : nullptr;
            bool isReject = info->isReject;

            Js::JavascriptGenerator* generator = nullptr;
            if (info->generator != TTD_INVALID_PTR_ID)
            {
                generator = reinterpret_cast<Js::JavascriptGenerator*>(inflator->LookupObject(info->generator));
            }

            Js::JavascriptMethod entryPoint = nullptr;
            switch (info->entryPoint)
            {
            case 1:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnStepNextFunction;
                break;
            case 2:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnStepThrowFunction;
                break;
            case 3:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnCallStepFunction;
                break;
            default:
                TTDAssert(false, "Unexpected value for entryPoint when inflating JavascriptAsyncSpawnStepFunction");
                break;
            }

            return ctx->GetLibrary()->CreateAsyncSpawnStepFunction(entryPoint, generator, argument, resolve, reject, isReject);
        }